

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O0

TValueCC calcCC(TKeyWaveformF *waveform0,TKeyWaveformF *waveform1,double sum0,double sum02,int is00,
               int is0,int is1)

{
  float fVar1;
  float fVar2;
  int iVar3;
  const_reference pvVar4;
  int in_ECX;
  int in_EDX;
  vector<float,_std::allocator<float>_> *in_RSI;
  vector<float,_std::allocator<float>_> *in_RDI;
  int in_R8D;
  double in_XMM0_Qa;
  double dVar5;
  double in_XMM1_Qa;
  double den2b;
  double den2a;
  double nom;
  int ncc;
  value_type a1;
  value_type a0;
  int is;
  double sum01;
  double sum12;
  double sum1;
  TValueCC cc;
  undefined4 local_54;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_40;
  
  local_40 = 0.0;
  local_48 = 0.0;
  local_50 = 0.0;
  for (local_54 = 0; local_54 < in_R8D - in_ECX; local_54 = local_54 + 1) {
    pvVar4 = std::vector<float,_std::allocator<float>_>::operator[]
                       (in_RDI,(long)(in_EDX + local_54));
    fVar1 = *pvVar4;
    pvVar4 = std::vector<float,_std::allocator<float>_>::operator[]
                       (in_RSI,(long)(in_ECX + local_54));
    fVar2 = *pvVar4;
    local_40 = (double)fVar2 + local_40;
    local_48 = (double)(fVar2 * fVar2) + local_48;
    local_50 = (double)(fVar1 * fVar2) + local_50;
  }
  iVar3 = in_R8D - in_ECX;
  dVar5 = sqrt((in_XMM1_Qa * (double)iVar3 + -(in_XMM0_Qa * in_XMM0_Qa)) *
               (local_48 * (double)iVar3 + -(local_40 * local_40)));
  return (local_50 * (double)iVar3 + -(in_XMM0_Qa * local_40)) / dVar5;
}

Assistant:

TValueCC calcCC(
    const TKeyWaveformF & waveform0,
    const TKeyWaveformF & waveform1,
    double sum0, double sum02,
    int is00, int is0, int is1) {
    TValueCC cc = -1.0f;

    double sum1 = 0.0f;
    double sum12 = 0.0f;
    double sum01 = 0.0f;
    for (int is = 0; is < is1 - is0; ++is) {
        auto a0 = waveform0[is00 + is];
        auto a1 = waveform1[is0 + is];

#ifdef MY_DEBUG
        if (is00 + is < 0 || is00 + is >= waveform0.size()) printf("BUG 0\n");
        if (is0 + is < 0 || is0 + is >= waveform1.size()) {
            printf("BUG 1\n");
            printf("%d %d %d\n", is0, is, (int) waveform1.size());
        }
#endif

        sum1 += a1;
        sum12 += a1*a1;
        sum01 += a0*a1;
    }

    int ncc = (is1 - is0);
    {
        double nom = sum01*ncc - sum0*sum1;
        double den2a = sum02*ncc - sum0*sum0;
        double den2b = sum12*ncc - sum1*sum1;
        cc = (nom)/(sqrt(den2a*den2b));
    }

    return cc;
}